

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

void helper_tw_ppc64(CPUPPCState_conflict2 *env,target_ulong arg1,target_ulong arg2,uint32_t flags)

{
  uint uVar1;
  uint uVar2;
  uintptr_t unaff_retaddr;
  bool local_26;
  uint32_t flags_local;
  target_ulong arg2_local;
  target_ulong arg1_local;
  CPUPPCState_conflict2 *env_local;
  
  uVar1 = (uint)arg1;
  uVar2 = (uint)arg2;
  if ((((((int)uVar2 <= (int)uVar1) || (local_26 = true, (flags & 0x10) == 0)) &&
       (((int)uVar1 <= (int)uVar2 || (local_26 = true, (flags & 8) == 0)))) &&
      ((uVar1 != uVar2 || (local_26 = true, (flags & 4) == 0)))) &&
     ((uVar2 <= uVar1 || (local_26 = true, (flags & 2) == 0)))) {
    local_26 = uVar2 < uVar1 && (flags & 1) != 0;
  }
  if (local_26) {
    raise_exception_err_ra_ppc64(env,6,0x40,unaff_retaddr);
  }
  return;
}

Assistant:

void helper_tw(CPUPPCState *env, target_ulong arg1, target_ulong arg2,
               uint32_t flags)
{
    if (!likely(!(((int32_t)arg1 < (int32_t)arg2 && (flags & 0x10)) ||
                  ((int32_t)arg1 > (int32_t)arg2 && (flags & 0x08)) ||
                  ((int32_t)arg1 == (int32_t)arg2 && (flags & 0x04)) ||
                  ((uint32_t)arg1 < (uint32_t)arg2 && (flags & 0x02)) ||
                  ((uint32_t)arg1 > (uint32_t)arg2 && (flags & 0x01))))) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_TRAP, GETPC());
    }
}